

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_decoder.c
# Opt level: O0

aom_codec_err_t
aom_codec_set_frame_buffer_functions
          (aom_codec_ctx_t *ctx,aom_get_frame_buffer_cb_fn_t cb_get,
          aom_release_frame_buffer_cb_fn_t cb_release,void *cb_priv)

{
  aom_codec_set_fb_fn_t_conflict p_Var1;
  aom_codec_alg_priv_t_conflict *paVar2;
  void *in_RCX;
  aom_release_frame_buffer_cb_fn_t in_RDX;
  aom_get_frame_buffer_cb_fn_t in_RSI;
  aom_codec_ctx_t *in_RDI;
  aom_codec_err_t res;
  aom_codec_err_t local_24;
  
  if (((in_RDI == (aom_codec_ctx_t *)0x0) || (in_RSI == (aom_get_frame_buffer_cb_fn_t)0x0)) ||
     (in_RDX == (aom_release_frame_buffer_cb_fn_t)0x0)) {
    local_24 = AOM_CODEC_INVALID_PARAM;
  }
  else if ((in_RDI->iface == (aom_codec_iface_t *)0x0) || (in_RDI->priv == (aom_codec_priv_t *)0x0))
  {
    local_24 = AOM_CODEC_ERROR;
  }
  else if ((in_RDI->iface->caps & 0x200000U) == 0) {
    local_24 = AOM_CODEC_INCAPABLE;
  }
  else {
    p_Var1 = (in_RDI->iface->dec).set_fb_fn;
    paVar2 = (aom_codec_alg_priv_t_conflict *)get_alg_priv(in_RDI);
    local_24 = (*p_Var1)(paVar2,in_RSI,in_RDX,in_RCX);
  }
  if (in_RDI != (aom_codec_ctx_t *)0x0) {
    in_RDI->err = local_24;
  }
  return local_24;
}

Assistant:

aom_codec_err_t aom_codec_set_frame_buffer_functions(
    aom_codec_ctx_t *ctx, aom_get_frame_buffer_cb_fn_t cb_get,
    aom_release_frame_buffer_cb_fn_t cb_release, void *cb_priv) {
  aom_codec_err_t res;

  if (!ctx || !cb_get || !cb_release) {
    res = AOM_CODEC_INVALID_PARAM;
  } else if (!ctx->iface || !ctx->priv) {
    res = AOM_CODEC_ERROR;
  } else if (!(ctx->iface->caps & AOM_CODEC_CAP_EXTERNAL_FRAME_BUFFER)) {
    res = AOM_CODEC_INCAPABLE;
  } else {
    res = ctx->iface->dec.set_fb_fn(get_alg_priv(ctx), cb_get, cb_release,
                                    cb_priv);
  }

  return SAVE_STATUS(ctx, res);
}